

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

long openjtalk_getWideCharCode(char16_t *text)

{
  ulong uVar1;
  ushort uVar2;
  bool bVar3;
  ushort *puVar4;
  
  if (text == (char16_t *)0x0) {
    return 0xc;
  }
  uVar2 = *text;
  if (uVar2 != 0) {
    puVar4 = text + 1;
    bVar3 = false;
    uVar1 = 0;
    do {
      uVar1 = (ulong)uVar2 | uVar1 << 0x10;
      if (bVar3) {
        return uVar1;
      }
      uVar2 = *puVar4;
      puVar4 = puVar4 + 1;
      bVar3 = true;
    } while (uVar2 != 0);
    return uVar1;
  }
  return 0;
}

Assistant:

OPENJTALK_DLL_API long OPENJTALK_CONVENTION openjtalk_getWideCharCode(char16_t *text)
{
	if (!text)
	{
		return OPENJTALKERROR_BUFFER_IS_NULL;
	}
	long res = 0;
	int count = 0;
	for (char16_t *p = text; *p != '\0'; p++)
	{
		res <<= sizeof(char16_t) * 8;
		res += ((long)*p) & 0xffff;
		if (++count == 2)
		{
			break;
		}
	}
	return (long)res;
}